

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O0

Color __thiscall RoughPlasticBSDF::f(RoughPlasticBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit)

{
  long in_RCX;
  vec3f *in_RDX;
  vec3f *in_RSI;
  vec3f *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  Color CVar4;
  Type allowed;
  bool through;
  vec3f wiL;
  vec3f woL;
  vec3f N2;
  vec3f N1;
  vec3f *in_stack_000001a8;
  vec3f *in_stack_000001b0;
  Color *in_stack_000001b8;
  RoughPlasticBSDF *in_stack_000001c0;
  float local_90;
  vec2f *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vec3f local_60;
  vec3f local_54;
  vec3f local_48;
  vec3f local_3c;
  long local_30;
  vec3f *local_28;
  undefined4 in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  float fStack_8;
  float local_4;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  vec3f::vec3f(&local_3c);
  vec3f::vec3f(&local_48);
  BSDF::getLocalBasis((vec3f *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI,
                      in_RSI);
  fVar1 = dot(in_RSI,&local_3c);
  fVar2 = dot(in_RSI,&local_48);
  fVar3 = dot(in_RSI,(vec3f *)(local_30 + 0x10));
  vec3f::vec3f(&local_54,fVar1,fVar2,fVar3);
  fVar1 = dot(local_28,&local_3c);
  fVar2 = dot(local_28,&local_48);
  fVar3 = dot(local_28,(vec3f *)(local_30 + 0x10));
  vec3f::vec3f(&local_60,fVar1,fVar2,fVar3);
  fVar1 = dot(in_RSI,(vec3f *)(local_30 + 0x1c));
  fVar2 = dot(local_28,(vec3f *)(local_30 + 0x1c));
  if (0.0 < fVar1 == 0.0 < fVar2) {
    BSDF::albedo((BSDF *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
    CVar4 = f(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001a8);
    in_stack_fffffffffffffff4 = CVar4.x;
    fStack_8 = CVar4.y;
    local_90 = CVar4.z;
    local_4 = local_90;
  }
  else {
    vec3f::vec3f((vec3f *)&stack0xfffffffffffffff4,0.0);
  }
  CVar4.y = fStack_8;
  CVar4.x = in_stack_fffffffffffffff4;
  CVar4.z = local_4;
  return CVar4;
}

Assistant:

Color f(const vec3f& wo, const vec3f& wi, const HitInfo& hit) const
	{
		vec3f N1,N2;
		getLocalBasis(hit.Ns, N1, N2);
		// transform wo, wi to local surface Ns' = (0,0,1)
		vec3f woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
		vec3f wiL = vec3f(dot(wi,N1), dot(wi,N2), dot(wi,hit.Ns));
		// use Ng to determine whether BRDF or BTDF is used
		bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
		BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
		return (BxDF::REFLECT & allowed)? f(albedo(hit.uv), woL, wiL): 0;
	}